

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_data.cpp
# Opt level: O2

void __thiscall
duckdb::StructColumnData::FetchRow
          (StructColumnData *this,TransactionData transaction,ColumnFetchState *state,row_t row_id,
          Vector *result,idx_t result_idx)

{
  vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_true>
  *this_00;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_01;
  reference pvVar1;
  type pCVar2;
  reference this_02;
  pointer pCVar3;
  reference this_03;
  type pVVar4;
  ulong uVar5;
  templated_unique_single_t child_state;
  unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_> local_50;
  DuckTransaction *local_48;
  transaction_t tStack_40;
  transaction_t local_38;
  
  this_01 = StructVector::GetEntries(result);
  this_00 = &state->child_states;
  for (uVar5 = (long)(state->child_states).
                     super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(state->child_states).
                     super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      uVar5 < ((long)(this_01->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this_01->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) + 1U; uVar5 = uVar5 + 1) {
    make_uniq<duckdb::ColumnFetchState>();
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>>>
                *)this_00,
               (unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
                *)&local_50);
    ::std::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>::
    ~unique_ptr(&local_50);
  }
  pvVar1 = vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_true>
           ::get<true>(this_00,0);
  pCVar2 = unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
           ::operator*(pvVar1);
  ColumnData::FetchRow
            (&(this->validity).super_ColumnData,transaction,pCVar2,row_id,result,result_idx);
  uVar5 = 0;
  while (uVar5 < (ulong)((long)(this_01->
                               super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                               ).
                               super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this_01->
                               super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                               ).
                               super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    this_02 = vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_true>
              ::get<true>(&this->sub_columns,uVar5);
    pCVar3 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
             operator->(this_02);
    local_48 = transaction.transaction.ptr;
    tStack_40 = transaction.transaction_id;
    local_38 = transaction.start_time;
    pvVar1 = vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_true>
             ::get<true>(this_00,uVar5 + 1);
    pCVar2 = unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
             ::operator*(pvVar1);
    this_03 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
              ::get<true>(this_01,uVar5);
    pVVar4 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       (this_03);
    (*pCVar3->_vptr_ColumnData[0x16])
              (pCVar3,pCVar2,row_id,pVVar4,result_idx,pCVar3->_vptr_ColumnData,local_48._0_4_,
               (undefined4)tStack_40,local_38);
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

void StructColumnData::FetchRow(TransactionData transaction, ColumnFetchState &state, row_t row_id, Vector &result,
                                idx_t result_idx) {
	// fetch validity mask
	auto &child_entries = StructVector::GetEntries(result);
	// insert any child states that are required
	for (idx_t i = state.child_states.size(); i < child_entries.size() + 1; i++) {
		auto child_state = make_uniq<ColumnFetchState>();
		state.child_states.push_back(std::move(child_state));
	}
	// fetch the validity state
	validity.FetchRow(transaction, *state.child_states[0], row_id, result, result_idx);
	// fetch the sub-column states
	for (idx_t i = 0; i < child_entries.size(); i++) {
		sub_columns[i]->FetchRow(transaction, *state.child_states[i + 1], row_id, *child_entries[i], result_idx);
	}
}